

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O3

int __thiscall TestHarness::PickType(TestHarness *this)

{
  int iVar1;
  long lVar2;
  pointer pTVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  
  if (49999 < this->num_tests_) {
    return -1;
  }
  this->num_tests_ = this->num_tests_ + 1;
  iVar1 = this->total_weight_;
  if ((long)iVar1 < 1) {
    pcVar7 = "Check failed: total_weight_ > 0\n";
  }
  else {
    lVar2 = random();
    pTVar3 = (this->types_).
             super__Vector_base<TestHarness::Type,_std::allocator<TestHarness::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar5 = (long)(this->types_).
                  super__Vector_base<TestHarness::Type,_std::allocator<TestHarness::Type>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pTVar3;
    if (lVar5 != 0) {
      lVar5 = (lVar5 >> 3) * -0x3333333333333333;
      uVar6 = lVar2 % (long)iVar1;
      lVar5 = lVar5 + (ulong)(lVar5 == 0);
      lVar2 = 0;
      do {
        uVar4 = (int)uVar6 - *(int *)((long)&pTVar3->weight + lVar2);
        uVar6 = (ulong)uVar4;
        if ((int)uVar4 < 0) {
          uVar4 = this->num_tests_;
          if ((uVar4 * 0xbcbe61d + 0xa7c50 >> 4 | uVar4 * -0x30000000) < 0x14f8b) {
            printf("  Test %d out of %d: %s\n",(ulong)uVar4,50000,
                   *(undefined8 *)((long)&(pTVar3->name)._M_dataplus + lVar2));
            pTVar3 = (this->types_).
                     super__Vector_base<TestHarness::Type,_std::allocator<TestHarness::Type>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          }
          return *(int *)((long)&pTVar3->type + lVar2);
        }
        lVar2 = lVar2 + 0x28;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    pcVar7 = "Check failed: i < types_.size()\n";
  }
  syscall(1,2,pcVar7,0x20);
  abort();
}

Assistant:

int TestHarness::PickType() {
  if (num_tests_ >= FLAGS_numtests) return -1;
  num_tests_++;

  CHECK(total_weight_ > 0);
  // This is a little skewed if total_weight_ doesn't divide 2^31, but it's close
  int v = Uniform(total_weight_);
  int i;
  for (i = 0; i < types_.size(); i++) {
    v -= types_[i].weight;
    if (v < 0) {
      break;
    }
  }

  CHECK(i < types_.size());
  if ((num_tests_ % FLAGS_log_every_n_tests) == 0) {
    printf("  Test %d out of %d: %s\n",
            num_tests_, FLAGS_numtests, types_[i].name.c_str());
  }
  return types_[i].type;
}